

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void gimage::anon_unknown_6::readRow<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *ret,uint32_t k,
               TiffImage<unsigned_char> *tif,uint32_t row,uint16_t d)

{
  uchar *ret_00;
  pointer puVar1;
  ulong uVar2;
  uint32_t i;
  ulong uVar3;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (ret,(ulong)tif->width,(ulong)tif->height,(ulong)tif->depth);
  if ((tif->is_planar == false) && (tif->depth != 1)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&tif->row,(ulong)((uint)tif->depth * tif->width));
    ret_00 = (tif->row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    readUnpacked<unsigned_char>
              (ret_00,*(int *)&(tif->row).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (int)ret_00,tif,row,0);
    puVar1 = (tif->row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar3 = 0; uVar3 < tif->width; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < tif->depth; uVar2 = uVar2 + 1) {
        ret->img[uVar2][k][uVar3] = puVar1[uVar2];
      }
      puVar1 = puVar1 + uVar2;
    }
    return;
  }
  readUnpacked<unsigned_char>(ret->img[d][k],tif->width,tif,row,d);
  return;
}

Assistant:

void readRow(gimage::Image<T> &ret, uint32_t k, TiffImage<T> &tif, uint32_t row,
  uint16_t d)
{
  ret.setSize(tif.width, tif.height, tif.depth);

  if (tif.is_planar || tif.depth == 1)
  {
    readUnpacked(ret.getPtr(0, k, d), tif.width, tif, row, d);
  }
  else
  {
    tif.row.resize(tif.width*tif.depth);
    readUnpacked(tif.row.data(), static_cast<uint32_t>(tif.row.size()), tif, row, 0);

    T *p=tif.row.data();
    for (uint32_t i=0; i<tif.width; i++)
    {
      for (uint16_t d=0; d<tif.depth; d++)
      {
        ret.set(i, k, d, *p++);
      }
    }
  }
}